

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraCodeBlocksGenerator::CreateDummyTargetFile_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,cmLocalGenerator *lg,
          cmGeneratorTarget *target)

{
  string *psVar1;
  ostream *poVar2;
  cmGeneratedFileStream fout;
  char local_2d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  cmAlphaNum local_2b8;
  undefined1 local_288 [32];
  byte abStack_268 [584];
  
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(lg);
  local_288._8_8_ = (psVar1->_M_dataplus)._M_p;
  local_288._0_8_ = psVar1->_M_string_length;
  local_2b8.View_._M_str = local_2b8.Digits_;
  local_2b8.View_._M_len = 1;
  local_2b8.Digits_[0] = '/';
  (*lg->_vptr_cmLocalGenerator[0xe])(&local_2d8,lg,target);
  local_2d9 = '/';
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  cmStrCat<std::__cxx11::string,char,std::__cxx11::string,char[8]>
            (__return_storage_ptr__,(cmAlphaNum *)local_288,&local_2b8,&local_2d8,&local_2d9,psVar1,
             (char (*) [8])".objlib");
  std::__cxx11::string::~string((string *)&local_2d8);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_288,__return_storage_ptr__,false,None);
  if ((abStack_268[(long)*(_func_int **)(local_288._0_8_ + -0x18)] & 5) == 0) {
    poVar2 = std::operator<<((ostream *)local_288,"# This is a dummy file for the OBJECT library ");
    psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    poVar2 = std::operator<<(poVar2,(string *)psVar1);
    poVar2 = std::operator<<(poVar2," for the CMake CodeBlocks project generator.\n");
    std::operator<<(poVar2,"# Don\'t edit, this file will be overwritten.\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_288);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::CreateDummyTargetFile(
  cmLocalGenerator* lg, cmGeneratorTarget* target) const
{
  // this file doesn't seem to be used by C::B in custom makefile mode,
  // but we generate a unique file for each OBJECT library so in case
  // C::B uses it in some way, the targets don't interfere with each other.
  std::string filename = cmStrCat(lg->GetCurrentBinaryDirectory(), '/',
                                  lg->GetTargetDirectory(target), '/',
                                  target->GetName(), ".objlib");
  cmGeneratedFileStream fout(filename);
  if (fout) {
    /* clang-format off */
    fout << "# This is a dummy file for the OBJECT library "
         << target->GetName()
         << " for the CMake CodeBlocks project generator.\n"
         << "# Don't edit, this file will be overwritten.\n";
    /* clang-format on */
  }
  return filename;
}